

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

char * al_get_new_window_title(void)

{
  long lVar1;
  long *plVar2;
  char *pcVar3;
  
  plVar2 = (long *)__tls_get_addr(&PTR_001d9500);
  if (*plVar2 == 0) {
    *plVar2 = (long)(plVar2 + 1);
    initialize_tls_values((thread_local_state *)(plVar2 + 1));
  }
  lVar1 = *plVar2;
  if ((lVar1 != 0) && (*(char *)(lVar1 + 0x124) != '\0')) {
    return (char *)(lVar1 + 0x124);
  }
  pcVar3 = al_get_app_name();
  return pcVar3;
}

Assistant:

const char *al_get_new_window_title(void)
{
   thread_local_state *tls;

   /* Return app name in case of error or if not set before. */
   if ((tls = tls_get()) == NULL)
      return al_get_app_name();

   if (strlen(tls->new_window_title) < 1)
      return al_get_app_name();


   return (const char *)tls->new_window_title;
}